

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::FunctionBody::GetStatementIndexAndLengthAt
          (FunctionBody *this,int byteCodeOffset,UINT32 *statementIndex,UINT32 *statementLength)

{
  Utf8SourceInfo *pUVar1;
  SRCINFO *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  StatementMap *pSVar7;
  
  if (statementIndex == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd8,"(statementIndex != nullptr)","statementIndex != nullptr");
    if (!bVar4) goto LAB_0076f0b3;
    *puVar6 = 0;
  }
  if (statementLength == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd9,"(statementLength != nullptr)","statementLength != nullptr");
    if (!bVar4) goto LAB_0076f0b3;
    *puVar6 = 0;
  }
  pUVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if ((((pUVar1->debugModeSource).ptr == (uchar *)0x0) && ((pUVar1->field_0xa8 & 0x20) == 0)) ||
     ((pUVar1->field_0xa8 & 0x40) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcdb,"(this->IsInDebugMode())","this->IsInDebugMode()");
    if (!bVar4) goto LAB_0076f0b3;
    *puVar6 = 0;
  }
  pSVar7 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
  if (pSVar7 == (StatementMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcde,"(statement != nullptr)","statement != nullptr");
    if (!bVar4) goto LAB_0076f0b3;
    *puVar6 = 0;
  }
  if (pSVar7 != (StatementMap *)0x0) {
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr ==
        (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xce7,"(m_utf8SourceInfo)","m_utf8SourceInfo");
      if (!bVar4) {
LAB_0076f0b3:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pSVar2 = (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr;
    if (pSVar2 == (SRCINFO *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = pSVar2->ulCharOffset - pSVar2->ichMinHost;
    }
    *statementIndex = iVar5 + (pSVar7->sourceSpan).begin;
    *statementLength = (pSVar7->sourceSpan).end - (pSVar7->sourceSpan).begin;
  }
  return pSVar7 != (StatementMap *)0x0;
}

Assistant:

bool FunctionBody::GetStatementIndexAndLengthAt(int byteCodeOffset, UINT32* statementIndex, UINT32* statementLength)
    {
        Assert(statementIndex != nullptr);
        Assert(statementLength != nullptr);

        Assert(this->IsInDebugMode());

        StatementMap * statement = GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
        Assert(statement != nullptr);

        // Bailout if we are unable to find a statement.
        // We shouldn't be missing these when a debugger is attached but we don't want to AV on retail builds.
        if (statement == nullptr)
        {
            return false;
        }

        Assert(m_utf8SourceInfo);
        const SRCINFO * srcInfo = GetUtf8SourceInfo()->GetSrcInfo();

        // Offset from the beginning of the document minus any host-supplied source characters.
        // Host supplied characters are inserted (for example) around onload:
        //      onload="foo('somestring', 0)" -> function onload(event).{.foo('somestring', 0).}
        ULONG offsetFromDocumentBegin = srcInfo ? srcInfo->ulCharOffset - srcInfo->ichMinHost : 0;

        *statementIndex = statement->sourceSpan.Begin() + offsetFromDocumentBegin;
        *statementLength = statement->sourceSpan.End() - statement->sourceSpan.Begin();
        return true;
    }